

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_get_execution_modes(spvc_compiler compiler,SpvExecutionMode **modes,size_t *num_modes)

{
  spvc_context psVar1;
  pointer this;
  Bitset *this_00;
  pointer pTVar2;
  SpvExecutionMode_ *pSVar3;
  size_t sVar4;
  exception *e;
  anon_class_8_1_ba1d6e4e local_48 [3];
  unique_ptr<TemporaryBuffer<SpvExecutionMode_>,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>_>
  local_30;
  unique_ptr<TemporaryBuffer<SpvExecutionMode_>,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>_>
  ptr;
  size_t *num_modes_local;
  SpvExecutionMode **modes_local;
  spvc_compiler compiler_local;
  
  ptr._M_t.
  super___uniq_ptr_impl<TemporaryBuffer<SpvExecutionMode_>,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_TemporaryBuffer<SpvExecutionMode_>_*,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>_>
  .super__Head_base<0UL,_TemporaryBuffer<SpvExecutionMode_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<TemporaryBuffer<SpvExecutionMode_>,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>,_true,_true>
        )(__uniq_ptr_data<TemporaryBuffer<SpvExecutionMode_>,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>,_true,_true>
          )num_modes;
  spvc_allocate<TemporaryBuffer<SpvExecutionMode_>>();
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  this_00 = spirv_cross::Compiler::get_execution_mode_bitset(this);
  local_48[0].ptr = &local_30;
  spirv_cross::Bitset::for_each_bit<spvc_compiler_get_execution_modes::__0>(this_00,local_48);
  pTVar2 = std::
           unique_ptr<TemporaryBuffer<SpvExecutionMode_>,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>_>
           ::operator->(&local_30);
  pSVar3 = spirv_cross::VectorView<SpvExecutionMode_>::data
                     (&(pTVar2->buffer).super_VectorView<SpvExecutionMode_>);
  *modes = pSVar3;
  pTVar2 = std::
           unique_ptr<TemporaryBuffer<SpvExecutionMode_>,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>_>
           ::operator->(&local_30);
  sVar4 = spirv_cross::VectorView<SpvExecutionMode_>::size
                    (&(pTVar2->buffer).super_VectorView<SpvExecutionMode_>);
  *(size_t *)
   ptr._M_t.
   super___uniq_ptr_impl<TemporaryBuffer<SpvExecutionMode_>,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_TemporaryBuffer<SpvExecutionMode_>_*,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>_>
   .super__Head_base<0UL,_TemporaryBuffer<SpvExecutionMode_>_*,_false>._M_head_impl = sVar4;
  psVar1 = compiler->context;
  std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
  unique_ptr<TemporaryBuffer<SpvExecutionMode_>,std::default_delete<TemporaryBuffer<SpvExecutionMode_>>,void>
            ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *)&e,
             &local_30);
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&psVar1->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
  ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::
  unique_ptr<TemporaryBuffer<SpvExecutionMode_>,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>_>
  ::~unique_ptr(&local_30);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_execution_modes(spvc_compiler compiler, const SpvExecutionMode **modes, size_t *num_modes)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto ptr = spvc_allocate<TemporaryBuffer<SpvExecutionMode>>();

		compiler->compiler->get_execution_mode_bitset().for_each_bit(
		    [&](uint32_t bit) { ptr->buffer.push_back(static_cast<SpvExecutionMode>(bit)); });

		*modes = ptr->buffer.data();
		*num_modes = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}